

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  string *field2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name1;
  string *field1;
  __type _Var1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference ppFVar6;
  string *psVar7;
  string *psVar8;
  reference pvVar9;
  _Bit_reference *p_Var10;
  reference this_00;
  LogMessage *pLVar11;
  mapped_type *this_01;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  AlphaNum *a;
  AlphaNum *a_00;
  reference rVar12;
  AlphaNum local_348;
  string local_318;
  AlphaNum local_2f8;
  string local_2c8;
  reference local_2a8;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  FieldGeneratorInfo info;
  FieldDescriptor *field_1;
  int i_1;
  reference local_1b0;
  reference local_1a0;
  reference local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  reference local_100;
  reference local_f0;
  string local_e0;
  string *local_c0;
  string *other_name;
  FieldDescriptor *other;
  undefined1 local_a8 [4];
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *name;
  FieldDescriptor *field;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  allocator<bool> local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> is_conflict;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Context *this_local;
  
  is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)fields;
  sVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(fields);
  std::allocator<bool>::allocator(&local_41);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_40,sVar4,&local_41);
  std::allocator<bool>::~allocator(&local_41);
  sVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&field + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,sVar4,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&field + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&field + 7));
  field._0_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(int)field;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar5) break;
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,(long)(int)field);
    name = (string *)*ppFVar6;
    UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)local_a8,(java *)name,field_00);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    other._4_4_ = (int)field;
    while( true ) {
      other._4_4_ = other._4_4_ + 1;
      uVar5 = (ulong)other._4_4_;
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
      if (sVar4 <= uVar5) break;
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage,(long)other._4_4_);
      other_name = (string *)*ppFVar6;
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_e0,(java *)other_name,field_01);
      local_c0 = &local_e0;
      _Var1 = std::operator==(local_88,local_c0);
      field1 = name;
      name1 = local_88;
      field2 = other_name;
      psVar7 = local_c0;
      if (_Var1) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(long)other._4_4_);
        local_f0 = rVar12;
        p_Var10 = std::_Bit_reference::operator=(&local_f0,true);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
        local_100 = rVar12;
        std::_Bit_reference::operator=(&local_100,p_Var10);
        psVar7 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)name);
        std::operator+(&local_180,"capitalized name of field \"",psVar7);
        std::operator+(&local_160,&local_180,"\" conflicts with field \"");
        psVar7 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)other_name);
        std::operator+(&local_140,&local_160,psVar7);
        std::operator+(&local_120,&local_140,"\"");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)other._4_4_);
        psVar8 = (string *)std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_120);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)(int)field);
        std::__cxx11::string::operator=((string *)pvVar9,psVar8);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
      }
      else {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)other._4_4_);
        bVar2 = anon_unknown_5::IsConflicting
                          ((FieldDescriptor *)field1,name1,(FieldDescriptor *)field2,psVar7,pvVar9);
        if (bVar2) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_40,(long)other._4_4_);
          local_190 = rVar12;
          p_Var10 = std::_Bit_reference::operator=(&local_190,true);
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
          local_1a0 = rVar12;
          std::_Bit_reference::operator=(&local_1a0,p_Var10);
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&i,(long)other._4_4_);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&i,(long)(int)field);
          std::__cxx11::string::operator=((string *)this_00,(string *)pvVar9);
        }
      }
      std::__cxx11::string::~string((string *)&local_e0);
    }
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
    local_1b0 = rVar12;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_1b0);
    if (bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&i_1,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
                 ,0x96);
      pLVar11 = internal::LogMessage::operator<<((LogMessage *)&i_1,"field \"");
      psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)name);
      pLVar11 = internal::LogMessage::operator<<(pLVar11,psVar7);
      pLVar11 = internal::LogMessage::operator<<(pLVar11,"\" is conflicting ");
      pLVar11 = internal::LogMessage::operator<<(pLVar11,"with another field: ");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)field);
      pLVar11 = internal::LogMessage::operator<<(pLVar11,pvVar9);
      internal::LogFinisher::operator=((LogFinisher *)((long)&field_1 + 7),pLVar11);
      internal::LogMessage::~LogMessage((LogMessage *)&i_1);
    }
    std::__cxx11::string::~string((string *)local_a8);
    field._0_4_ = (int)field + 1;
  }
  field_1._0_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(int)field_1;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar5) break;
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,(long)(int)field_1);
    info.disambiguated_reason.field_2._8_8_ = *ppFVar6;
    FieldGeneratorInfo::FieldGeneratorInfo((FieldGeneratorInfo *)local_258);
    CamelCaseFieldName_abi_cxx11_
              (&local_278,(java *)info.disambiguated_reason.field_2._8_8_,field_02);
    std::__cxx11::string::operator=((string *)local_258,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    UnderscoresToCapitalizedCamelCase_abi_cxx11_
              (&local_298,(java *)info.disambiguated_reason.field_2._8_8_,field_03);
    std::__cxx11::string::operator=
              ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field_1);
    local_2a8 = rVar12;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_2a8);
    if (bVar2) {
      iVar3 = FieldDescriptor::number((FieldDescriptor *)info.disambiguated_reason.field_2._8_8_);
      strings::AlphaNum::AlphaNum(&local_2f8,iVar3);
      StrCat_abi_cxx11_(&local_2c8,(protobuf *)&local_2f8,a);
      std::__cxx11::string::operator+=((string *)local_258,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      iVar3 = FieldDescriptor::number((FieldDescriptor *)info.disambiguated_reason.field_2._8_8_);
      strings::AlphaNum::AlphaNum(&local_348,iVar3);
      StrCat_abi_cxx11_(&local_318,(protobuf *)&local_348,a_00);
      std::__cxx11::string::operator+=
                ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)field_1);
      std::__cxx11::string::operator=
                ((string *)(info.capitalized_name.field_2._M_local_buf + 8),(string *)pvVar9);
    }
    this_01 = std::
              map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
              ::operator[](&this->field_generator_info_map_,
                           (key_type *)((long)&info.disambiguated_reason.field_2 + 8));
    FieldGeneratorInfo::operator=(this_01,(FieldGeneratorInfo *)local_258);
    FieldGeneratorInfo::~FieldGeneratorInfo((FieldGeneratorInfo *)local_258);
    field_1._0_4_ = (int)field_1 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_40)
  ;
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}